

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::GenerateNodeAnimations
          (FBXConverter *this,vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims,
          string *fixed_name,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  pointer ppAVar1;
  iterator __position;
  bool bVar2;
  AnimationCurveMap *pAVar3;
  vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
  *this_00;
  FBXConverter *target;
  char *__s;
  iterator curves_00;
  mapped_type *pmVar4;
  aiNodeAnim *paVar5;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  uint uVar6;
  pointer ppAVar7;
  FBXConverter *this_01;
  iterator iVar8;
  TransformationComp TVar9;
  _Base_ptr p_Var10;
  Object *pOVar11;
  Object *pOVar12;
  uint uVar13;
  ulong uVar14;
  AnimationCurveNode *pAVar15;
  AnimationCurveNode *this_02;
  long lVar16;
  bool bVar17;
  aiNodeAnim *na;
  AnimationCurveNode *node;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *local_290;
  ulong local_288;
  aiNodeAnim *inv;
  ulong local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  NodeMap node_property_map;
  const_iterator chain [17];
  aiNodeAnim *nd;
  pointer local_198 [12];
  ios_base local_138 [264];
  
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar7 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_290 = (vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)node_anims;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppAVar1 == ppAVar7) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xae1,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  bVar2 = this->doc->settings->strictMode;
  pOVar11 = (Object *)0x0;
  do {
    pAVar15 = *ppAVar7;
    pOVar12 = pAVar15->target;
    if ((pOVar11 != (Object *)0x0) && (bVar17 = pOVar12 != pOVar11, pOVar12 = pOVar11, bVar17)) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x5e1e9d);
    }
    if ((bVar2 != false) && (pAVar15->target != pOVar12)) {
      __assert_fail("node->Target() == target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0xad0,
                    "void Assimp::FBX::validateAnimCurveNodes(const std::vector<const AnimationCurveNode *> &, bool)"
                   );
    }
    ppAVar7 = ppAVar7 + 1;
    pOVar11 = pOVar12;
  } while (ppAVar7 != ppAVar1);
  ppAVar7 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar7 != ppAVar1) {
    pAVar15 = (AnimationCurveNode *)0x0;
    do {
      this_02 = *ppAVar7;
      node = this_02;
      if (this_02 == (AnimationCurveNode *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0xae8,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      if ((this_02->prop)._M_string_length == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                       "target property for animation curve not set: ",&(this_02->super_Object).name
                      );
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
        std::ios_base::~ios_base(local_138);
        this_02 = pAVar15;
        if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
          operator_delete(chain[0]._M_node,(ulong)((long)&(chain[2]._M_node)->_M_color + 1));
        }
      }
      else {
        pAVar3 = AnimationCurveNode::Curves_abi_cxx11_(this_02);
        if ((pAVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                         "no animation curves assigned to AnimationCurveNode: ",
                         &(node->super_Object).name);
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
          std::ios_base::~ios_base(local_138);
          if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
            operator_delete(chain[0]._M_node,(ulong)((long)&(chain[2]._M_node)->_M_color + 1));
          }
        }
        else {
          this_00 = (vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                       ::operator[](&node_property_map,&node->prop);
          __position._M_current = *(AnimationCurveNode ***)(this_00 + 8);
          if (__position._M_current == *(AnimationCurveNode ***)(this_00 + 0x10)) {
            std::
            vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
            ::_M_realloc_insert<Assimp::FBX::AnimationCurveNode_const*const&>
                      (this_00,__position,&node);
          }
          else {
            *__position._M_current = node;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
      }
      ppAVar7 = ppAVar7 + 1;
      pAVar15 = this_02;
    } while (ppAVar7 != ppAVar1);
    if (this_02 != (AnimationCurveNode *)0x0) {
      if ((this_02->target == (Object *)0x0) ||
         (target = (FBXConverter *)
                   __dynamic_cast(this_02->target,&Object::typeinfo,&Model::typeinfo,0),
         target == (FBXConverter *)0x0)) {
        __assert_fail("curve_node->TargetAsModel()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0xaf9,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      paVar5 = (aiNodeAnim *)chain;
      uVar14 = 0;
      iVar8._M_current = (aiNodeAnim **)0x0;
      memset(paVar5,0,0x88);
      local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(target->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      lVar16 = 0;
      local_288 = 0;
LAB_005e20bd:
      lVar16 = lVar16 + 1;
      local_278 = uVar14;
      do {
        TVar9 = (int)lVar16 - TransformationComp_GeometricRotationInverse;
        if ((TVar9 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) ==
            TransformationComp_RotationPivotInverse) {
          chain[lVar16 + -1]._M_node =
               &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
        }
        else {
          __s = NameTransformationCompProperty((FBXConverter *)paVar5,TVar9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&nd,__s,(allocator<char> *)&node);
          iVar8._M_current = &nd;
          curves_00 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                      ::find(&node_property_map._M_t,(key_type *)&nd);
          chain[lVar16 + -1]._M_node = curves_00._M_node;
          paVar5 = nd;
          if (nd != (aiNodeAnim *)local_198) {
            iVar8._M_current = (aiNodeAnim **)((long)local_198[0] + 1);
            operator_delete(nd,(ulong)iVar8._M_current);
          }
          if ((_Rb_tree_header *)curves_00._M_node !=
              &node_property_map._M_t._M_impl.super__Rb_tree_header) {
            if (this->doc->settings->optimizeEmptyAnimationCurves != true) goto LAB_005e21f0;
            curves_00._M_node = curves_00._M_node + 2;
            iVar8._M_current = (aiNodeAnim **)target;
            bVar2 = IsRedundantAnimationData
                              ((FBXConverter *)paVar5,(Model *)target,TVar9,
                               (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                *)curves_00._M_node);
            if (!bVar2) goto LAB_005e21f0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &node,"dropping redundant animation channel for node ",local_270);
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
            LogFunctions<Assimp::FBXImporter>::LogDebug((format *)&nd);
            iVar8._M_current = (aiNodeAnim **)&std::__cxx11::ostringstream::VTT;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
            std::ios_base::~ios_base(local_138);
            paVar5 = (aiNodeAnim *)node;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)node != &local_2a0) {
              iVar8._M_current = (aiNodeAnim **)(local_2a0._M_allocated_capacity + 1);
              operator_delete(node,(ulong)iVar8._M_current);
            }
          }
        }
        lVar16 = lVar16 + 1;
        if (lVar16 == 0x12) {
          if ((local_278 & 1) != 0) goto LAB_005e2225;
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x5e2538);
          goto LAB_005e2552;
        }
      } while( true );
    }
  }
  __assert_fail("curve_node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0xaf8,
                "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
               );
LAB_005e21f0:
  local_288 = CONCAT71((int7)(local_288 >> 8),
                       (byte)local_288 |
                       ((TVar9 & (TransformationComp_GeometricScaling|
                                 TransformationComp_ScalingPivot)) != TransformationComp_Translation
                       && lVar16 != 0xd));
  uVar14 = CONCAT71((int7)((ulong)curves_00._M_node >> 8),1);
  if (lVar16 == 0x11) goto LAB_005e2225;
  goto LAB_005e20bd;
LAB_005e2225:
  if (((local_288 & 1) != 0) ||
     (iVar8._M_current = (aiNodeAnim **)target,
     bVar2 = NeedsComplexTransformationChain((FBXConverter *)paVar5,(Model *)target), bVar2)) {
    lVar16 = 0;
    uVar13 = 1;
    uVar6 = 0;
    do {
      p_Var10 = chain[lVar16]._M_node;
      if ((_Rb_tree_header *)p_Var10 != &node_property_map._M_t._M_impl.super__Rb_tree_header) {
        if (lVar16 == 0xd) {
          __assert_fail("comp != TransformationComp_ScalingPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0xb4c,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        if (lVar16 == 9) {
          __assert_fail("comp != TransformationComp_RotationPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0xb4b,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        TVar9 = (TransformationComp)lVar16;
        NameTransformationChainNode((string *)&nd,(FBXConverter *)iVar8._M_current,fixed_name,TVar9)
        ;
        na = (aiNodeAnim *)0x0;
        if (TransformationComp_GeometricScaling < TVar9) {
LAB_005e27c2:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0xbb0,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        uVar6 = uVar6 | uVar13;
        if ((0x4c38U >>
             (TVar9 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation)) &
            1) == 0) {
          if ((0x81c0U >>
               (TVar9 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation))
              & 1) != 0) {
            na = GenerateRotationNodeAnim
                           (this,(string *)&nd,(Model *)target,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var10 + 2),layer_map,start,stop,max_time,min_time);
            goto LAB_005e247d;
          }
          if ((0x11000U >>
               (TVar9 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation))
              & 1) == 0) goto LAB_005e27c2;
          na = GenerateScalingNodeAnim
                         (this,(string *)&nd,extraout_RDX,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)(p_Var10 + 2),layer_map,start,stop,max_time,min_time);
        }
        else {
          p_Var10 = p_Var10 + 2;
          this_01 = (FBXConverter *)&nd;
          na = GenerateTranslationNodeAnim
                         (this,(string *)&nd,extraout_RDX,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)p_Var10,layer_map,start,stop,max_time,min_time,false);
          if (lVar16 == 5) {
            NameTransformationChainNode
                      ((string *)&node,this_01,fixed_name,TransformationComp_RotationPivotInverse);
            paVar5 = GenerateTranslationNodeAnim
                               (this,(string *)&node,extraout_RDX_00,
                                (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                 *)p_Var10,layer_map,start,stop,max_time,min_time,true);
            inv = paVar5;
            if (paVar5 == (aiNodeAnim *)0x0) {
              __assert_fail("inv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb7d,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
            if (((paVar5->mNumPositionKeys == 0) && (paVar5->mNumRotationKeys == 0)) &&
               (paVar5->mNumScalingKeys == 0)) {
              aiNodeAnim::~aiNodeAnim(paVar5);
              operator_delete(paVar5,0x438);
            }
            else {
              iVar8._M_current = *(aiNodeAnim ***)(local_290 + 8);
              if (iVar8._M_current == *(aiNodeAnim ***)(local_290 + 0x10)) {
                std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
                _M_realloc_insert<aiNodeAnim*const&>(local_290,iVar8,&inv);
              }
              else {
                *iVar8._M_current = paVar5;
                *(long *)(local_290 + 8) = *(long *)(local_290 + 8) + 8;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)node != &local_2a0) {
              operator_delete(node,local_2a0._M_allocated_capacity + 1);
            }
            uVar6 = uVar6 | uVar13 << 4;
          }
          else if (lVar16 == 0xb) {
            NameTransformationChainNode
                      ((string *)&node,this_01,fixed_name,TransformationComp_ScalingPivotInverse);
            paVar5 = GenerateTranslationNodeAnim
                               (this,(string *)&node,extraout_RDX_01,
                                (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                 *)p_Var10,layer_map,start,stop,max_time,min_time,true);
            inv = paVar5;
            if (paVar5 != (aiNodeAnim *)0x0) {
              if (((paVar5->mNumPositionKeys == 0) && (paVar5->mNumRotationKeys == 0)) &&
                 (paVar5->mNumScalingKeys == 0)) {
                aiNodeAnim::~aiNodeAnim(paVar5);
                operator_delete(paVar5,0x438);
              }
              else {
                std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                          ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_290,&inv);
              }
              __assert_fail("TransformationComp_RotationPivotInverse > i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb9d,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
            __assert_fail("inv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0xb95,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
LAB_005e247d:
          if (na == (aiNodeAnim *)0x0) {
            __assert_fail("na",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0xbb3,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
        }
        paVar5 = na;
        if (((na->mNumPositionKeys == 0) && (na->mNumRotationKeys == 0)) &&
           (na->mNumScalingKeys == 0)) {
          aiNodeAnim::~aiNodeAnim(na);
          iVar8._M_current = (aiNodeAnim **)0x438;
          operator_delete(paVar5,0x438);
        }
        else {
          iVar8._M_current = *(aiNodeAnim ***)(local_290 + 8);
          if (iVar8._M_current == *(aiNodeAnim ***)(local_290 + 0x10)) {
            std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
            _M_realloc_insert<aiNodeAnim*const&>(local_290,iVar8,&na);
          }
          else {
            *iVar8._M_current = na;
            *(long *)(local_290 + 8) = *(long *)(local_290 + 8) + 8;
          }
        }
        if (nd != (aiNodeAnim *)local_198) {
          iVar8._M_current = (aiNodeAnim **)((long)local_198[0] + 1);
          operator_delete(nd,(ulong)iVar8._M_current);
        }
      }
      lVar16 = lVar16 + 1;
      uVar13 = uVar13 * 2;
    } while (lVar16 != 0x11);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&this->node_anim_chain_bits,fixed_name);
    *pmVar4 = uVar6;
  }
  else {
    paVar5 = GenerateSimpleNodeAnim
                       (this,fixed_name,(Model *)target,chain,
                        (const_iterator)&node_property_map._M_t._M_impl.super__Rb_tree_header,
                        layer_map,start,stop,max_time,min_time,true);
    nd = paVar5;
    if (paVar5 == (aiNodeAnim *)0x0) {
      __assert_fail("nd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0xb35,
                    "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                   );
    }
    if (((paVar5->mNumPositionKeys == 0) && (paVar5->mNumRotationKeys == 0)) &&
       (paVar5->mNumScalingKeys == 0)) {
      aiNodeAnim::~aiNodeAnim(paVar5);
      operator_delete(paVar5,0x438);
    }
    else {
      iVar8._M_current = *(aiNodeAnim ***)(local_290 + 8);
      if (iVar8._M_current == *(aiNodeAnim ***)(local_290 + 0x10)) {
        std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::_M_realloc_insert<aiNodeAnim*const&>
                  (local_290,iVar8,&nd);
      }
      else {
        *iVar8._M_current = paVar5;
        *(long *)(local_290 + 8) = *(long *)(local_290 + 8) + 8;
      }
    }
  }
LAB_005e2552:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::~_Rb_tree(&node_property_map._M_t);
  return;
}

Assistant:

void FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim*>& node_anims,
            const std::string& fixed_name,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {

            NodeMap node_property_map;
            ai_assert(curves.size());

#ifdef ASSIMP_BUILD_DEBUG
            validateAnimCurveNodes(curves, doc.Settings().strictMode);
#endif
            const AnimationCurveNode* curve_node = nullptr;
            for (const AnimationCurveNode* node : curves) {
                ai_assert(node);

                if (node->TargetProperty().empty()) {
                    FBXImporter::LogWarn("target property for animation curve not set: " + node->Name());
                    continue;
                }

                curve_node = node;
                if (node->Curves().empty()) {
                    FBXImporter::LogWarn("no animation curves assigned to AnimationCurveNode: " + node->Name());
                    continue;
                }

                node_property_map[node->TargetProperty()].push_back(node);
            }

            ai_assert(curve_node);
            ai_assert(curve_node->TargetAsModel());

            const Model& target = *curve_node->TargetAsModel();

            // check for all possible transformation components
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM];

            bool has_any = false;
            bool has_complex = false;

            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                // inverse pivots don't exist in the input, we just generate them
                if (comp == TransformationComp_RotationPivotInverse || comp == TransformationComp_ScalingPivotInverse) {
                    chain[i] = node_property_map.end();
                    continue;
                }

                chain[i] = node_property_map.find(NameTransformationCompProperty(comp));
                if (chain[i] != node_property_map.end()) {

                    // check if this curves contains redundant information by looking
                    // up the corresponding node's transformation chain.
                    if (doc.Settings().optimizeEmptyAnimationCurves &&
                        IsRedundantAnimationData(target, comp, (*chain[i]).second)) {

                        FBXImporter::LogDebug("dropping redundant animation channel for node " + target.Name());
                        continue;
                    }

                    has_any = true;

                    if (comp != TransformationComp_Rotation && comp != TransformationComp_Scaling && comp != TransformationComp_Translation)
                    {
                        has_complex = true;
                    }
                }
            }

            if (!has_any) {
                FBXImporter::LogWarn("ignoring node animation, did not find any transformation key frames");
                return;
            }

            // this needs to play nicely with GenerateTransformationNodeChain() which will
            // be invoked _later_ (animations come first). If this node has only rotation,
            // scaling and translation _and_ there are no animated other components either,
            // we can use a single node and also a single node animation channel.
            if (!has_complex && !NeedsComplexTransformationChain(target)) {

                aiNodeAnim* const nd = GenerateSimpleNodeAnim(fixed_name, target, chain,
                    node_property_map.end(),
                    layer_map,
                    start, stop,
                    max_time,
                    min_time,
                    true // input is TRS order, assimp is SRT
                );

                ai_assert(nd);
                if (nd->mNumPositionKeys == 0 && nd->mNumRotationKeys == 0 && nd->mNumScalingKeys == 0) {
                    delete nd;
                }
                else {
                    node_anims.push_back(nd);
                }
                return;
            }

            // otherwise, things get gruesome and we need separate animation channels
            // for each part of the transformation chain. Remember which channels
            // we generated and pass this information to the node conversion
            // code to avoid nodes that have identity transform, but non-identity
            // animations, being dropped.
            unsigned int flags = 0, bit = 0x1;
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (chain[i] != node_property_map.end()) {
                    flags |= bit;

                    ai_assert(comp != TransformationComp_RotationPivotInverse);
                    ai_assert(comp != TransformationComp_ScalingPivotInverse);

                    const std::string& chain_name = NameTransformationChainNode(fixed_name, comp);

                    aiNodeAnim* na = nullptr;
                    switch (comp)
                    {
                    case TransformationComp_Rotation:
                    case TransformationComp_PreRotation:
                    case TransformationComp_PostRotation:
                    case TransformationComp_GeometricRotation:
                        na = GenerateRotationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    case TransformationComp_RotationOffset:
                    case TransformationComp_RotationPivot:
                    case TransformationComp_ScalingOffset:
                    case TransformationComp_ScalingPivot:
                    case TransformationComp_Translation:
                    case TransformationComp_GeometricTranslation:
                        na = GenerateTranslationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        // pivoting requires us to generate an implicit inverse channel to undo the pivot translation
                        if (comp == TransformationComp_RotationPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_RotationPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }
                        else if (comp == TransformationComp_ScalingPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_ScalingPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }

                        break;

                    case TransformationComp_Scaling:
                    case TransformationComp_GeometricScaling:
                        na = GenerateScalingNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    default:
                        ai_assert(false);
                    }

                    ai_assert(na);
                    if (na->mNumPositionKeys == 0 && na->mNumRotationKeys == 0 && na->mNumScalingKeys == 0) {
                        delete na;
                    }
                    else {
                        node_anims.push_back(na);
                    }
                    continue;
                }
            }

            node_anim_chain_bits[fixed_name] = flags;
        }